

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O1

cmServerResponse * __thiscall
cmServer::SetProtocolVersion
          (cmServerResponse *__return_storage_ptr__,cmServer *this,cmServerRequest *request)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  Int major;
  Int minor;
  long *plVar3;
  Value *pVVar4;
  cmServerProtocol *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  undefined8 uVar6;
  ValueHolder VVar7;
  string errorMessage;
  Value minorValue;
  Value majorValue;
  Value requestedProtocolVersion;
  ValueHolder local_f0;
  long local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  ValueHolder local_c8;
  undefined8 local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  ValueHolder local_a8;
  long local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  ValueHolder local_80;
  long local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  ValueHolder local_58;
  long local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  __n = (request->Type)._M_string_length;
  if ((__n != kHANDSHAKE_TYPE_abi_cxx11_._M_string_length) ||
     ((__n != 0 &&
      (iVar2 = bcmp((request->Type)._M_dataplus._M_p,kHANDSHAKE_TYPE_abi_cxx11_._M_dataplus._M_p,__n
                   ), iVar2 != 0)))) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80,
                   "Waiting for type \"",&kHANDSHAKE_TYPE_abi_cxx11_);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_80.int_);
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 == paVar5) {
      local_48._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_48._8_8_ = plVar3[3];
      local_58.string_ = (char *)&local_48;
    }
    else {
      local_48._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_58.string_ = ((char *)*plVar3).string_;
    }
    local_50 = plVar3[1];
    *plVar3 = (long)paVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)&local_58);
    if (local_58 != &local_48) {
      operator_delete(local_58.string_,local_48._M_allocated_capacity + 1);
    }
    if (local_80 == &local_70) {
      return __return_storage_ptr__;
    }
    operator_delete(local_80.string_,local_70._M_allocated_capacity + 1);
    return __return_storage_ptr__;
  }
  pVVar4 = Json::Value::operator[](&request->Data,&kPROTOCOL_VERSION_KEY_abi_cxx11_);
  Json::Value::Value((Value *)&local_58,pVVar4);
  bVar1 = Json::Value::isNull((Value *)&local_58);
  if (bVar1) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c8,
                   "\"",&kPROTOCOL_VERSION_KEY_abi_cxx11_);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_c8.int_);
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 == paVar5) {
      local_e0._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_e0._8_8_ = plVar3[3];
      local_f0.string_ = (char *)&local_e0;
    }
    else {
      local_e0._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_f0.string_ = ((char *)*plVar3).string_;
    }
    local_e8 = plVar3[1];
    *plVar3 = (long)paVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_f0.int_,
                                (ulong)kHANDSHAKE_TYPE_abi_cxx11_._M_dataplus._M_p);
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 == paVar5) {
      local_98._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_98._8_8_ = plVar3[3];
      local_a8.string_ = (char *)&local_98;
    }
    else {
      local_98._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_a8.string_ = ((char *)*plVar3).string_;
    }
    local_a0 = plVar3[1];
    *plVar3 = (long)paVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_a8.int_);
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 == paVar5) {
      local_70._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_70._8_8_ = plVar3[3];
      local_80.string_ = (char *)&local_70;
    }
    else {
      local_70._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_80.string_ = ((char *)*plVar3).string_;
    }
    local_78 = plVar3[1];
    *plVar3 = (long)paVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)&local_80);
    if (local_80 != &local_70) {
      operator_delete(local_80.string_,local_70._M_allocated_capacity + 1);
    }
    if (local_a8 != &local_98) {
      operator_delete(local_a8.string_,local_98._M_allocated_capacity + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0.string_,local_e0._M_allocated_capacity + 1);
    }
    if (local_c8 == &local_b8) goto LAB_003c3fb8;
    uVar6 = CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0]);
    VVar7 = local_c8;
  }
  else {
    bVar1 = Json::Value::isObject((Value *)&local_58);
    if (bVar1) {
      pVVar4 = Json::Value::operator[]((Value *)&local_58,&kMAJOR_KEY_abi_cxx11_);
      Json::Value::Value((Value *)&local_80,pVVar4);
      bVar1 = Json::Value::isInt((Value *)&local_80);
      if (bVar1) {
        pVVar4 = Json::Value::operator[]((Value *)&local_58,&kMINOR_KEY_abi_cxx11_);
        Json::Value::Value((Value *)&local_a8,pVVar4);
        bVar1 = Json::Value::isNull((Value *)&local_a8);
        if ((bVar1) || (bVar1 = Json::Value::isInt((Value *)&local_a8), bVar1)) {
          major = Json::Value::asInt((Value *)&local_80);
          bVar1 = Json::Value::isNull((Value *)&local_a8);
          minor = -1;
          if (!bVar1) {
            minor = Json::Value::asInt((Value *)&local_a8);
          }
          if (major < 0) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_c8,"\"",&kMAJOR_KEY_abi_cxx11_);
            plVar3 = (long *)std::__cxx11::string::append((char *)&local_c8.int_);
            local_f0.string_ = (char *)&local_e0;
            paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(plVar3 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar3 == paVar5) {
              local_e0._M_allocated_capacity = paVar5->_M_allocated_capacity;
              local_e0._8_8_ = plVar3[3];
            }
            else {
              local_e0._M_allocated_capacity = paVar5->_M_allocated_capacity;
              local_f0.string_ = ((char *)*plVar3).string_;
            }
            local_e8 = plVar3[1];
            *plVar3 = (long)paVar5;
            plVar3[1] = 0;
            *(undefined1 *)(plVar3 + 2) = 0;
            cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)&local_f0);
            goto LAB_003c3f72;
          }
          bVar1 = Json::Value::isNull((Value *)&local_a8);
          if (minor < 0 && !bVar1) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_c8,"\"",&kMINOR_KEY_abi_cxx11_);
            plVar3 = (long *)std::__cxx11::string::append((char *)&local_c8.int_);
            local_f0.string_ = (char *)&local_e0;
            paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(plVar3 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar3 == paVar5) {
              local_e0._M_allocated_capacity = paVar5->_M_allocated_capacity;
              local_e0._8_8_ = plVar3[3];
            }
            else {
              local_e0._M_allocated_capacity = paVar5->_M_allocated_capacity;
              local_f0.string_ = ((char *)*plVar3).string_;
            }
            local_e8 = plVar3[1];
            *plVar3 = (long)paVar5;
            plVar3[1] = 0;
            *(undefined1 *)(plVar3 + 2) = 0;
            cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)&local_f0);
            goto LAB_003c3f72;
          }
          this_00 = FindMatchingProtocol(&this->SupportedProtocols,major,minor);
          this->Protocol = this_00;
          if (this_00 == (cmServerProtocol *)0x0) {
            local_f0.string_ = (char *)&local_e0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_f0,"Protocol version not supported.","");
            cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)&local_f0);
            uVar6 = local_e0._M_allocated_capacity;
            VVar7 = local_f0;
            if (local_f0 == &local_e0) goto LAB_003c3fa4;
            goto LAB_003c3f9c;
          }
          local_c0 = 0;
          local_b8._M_local_buf[0] = '\0';
          local_c8.string_ = (char *)&local_b8;
          bVar1 = cmServerProtocol::Activate(this_00,this,request,(string *)&local_c8);
          if (bVar1) {
            Json::Value::Value((Value *)&local_f0,objectValue);
            cmServerRequest::Reply(__return_storage_ptr__,request,(Value *)&local_f0);
            Json::Value::~Value((Value *)&local_f0);
          }
          else {
            this->Protocol = (cmServerProtocol *)0x0;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_f0,"Failed to activate protocol version: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_c8);
            cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)&local_f0);
            if (local_f0 != &local_e0) {
              operator_delete(local_f0.string_,local_e0._M_allocated_capacity + 1);
            }
          }
          if (local_c8 != &local_b8) goto LAB_003c3f97;
        }
        else {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_c8,"\"",&kMINOR_KEY_abi_cxx11_);
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_c8.int_);
          local_f0.string_ = (char *)&local_e0;
          paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar3 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar3 == paVar5) {
            local_e0._M_allocated_capacity = paVar5->_M_allocated_capacity;
            local_e0._8_8_ = plVar3[3];
          }
          else {
            local_e0._M_allocated_capacity = paVar5->_M_allocated_capacity;
            local_f0.string_ = ((char *)*plVar3).string_;
          }
          local_e8 = plVar3[1];
          *plVar3 = (long)paVar5;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)&local_f0);
LAB_003c3f72:
          if (local_f0 != &local_e0) {
            operator_delete(local_f0.string_,local_e0._M_allocated_capacity + 1);
          }
          if (local_c8 != &local_b8) {
LAB_003c3f97:
            uVar6 = CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0]);
            VVar7 = local_c8;
LAB_003c3f9c:
            operator_delete(VVar7.string_,uVar6 + 1);
          }
        }
LAB_003c3fa4:
        Json::Value::~Value((Value *)&local_a8);
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_f0,"\"",&kMAJOR_KEY_abi_cxx11_);
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_f0.int_);
        paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 == paVar5) {
          local_98._M_allocated_capacity = paVar5->_M_allocated_capacity;
          local_98._8_8_ = plVar3[3];
          local_a8.string_ = (char *)&local_98;
        }
        else {
          local_98._M_allocated_capacity = paVar5->_M_allocated_capacity;
          local_a8.string_ = ((char *)*plVar3).string_;
        }
        local_a0 = plVar3[1];
        *plVar3 = (long)paVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)&local_a8);
        if (local_a8 != &local_98) {
          operator_delete(local_a8.string_,local_98._M_allocated_capacity + 1);
        }
        if (local_f0 != &local_e0) {
          operator_delete(local_f0.string_,local_e0._M_allocated_capacity + 1);
        }
      }
      Json::Value::~Value((Value *)&local_80);
      goto LAB_003c3fb8;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8,
                   "\"",&kPROTOCOL_VERSION_KEY_abi_cxx11_);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_a8.int_);
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 == paVar5) {
      local_70._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_70._8_8_ = plVar3[3];
      local_80.string_ = (char *)&local_70;
    }
    else {
      local_70._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_80.string_ = ((char *)*plVar3).string_;
    }
    local_78 = plVar3[1];
    *plVar3 = (long)paVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)&local_80);
    if (local_80 != &local_70) {
      operator_delete(local_80.string_,local_70._M_allocated_capacity + 1);
    }
    uVar6 = local_98._M_allocated_capacity;
    VVar7 = local_a8;
    if (local_a8 == &local_98) goto LAB_003c3fb8;
  }
  operator_delete(VVar7.string_,uVar6 + 1);
LAB_003c3fb8:
  Json::Value::~Value((Value *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

cmServerResponse cmServer::SetProtocolVersion(const cmServerRequest& request)
{
  if (request.Type != kHANDSHAKE_TYPE) {
    return request.ReportError("Waiting for type \"" + kHANDSHAKE_TYPE +
                               "\".");
  }

  Json::Value requestedProtocolVersion = request.Data[kPROTOCOL_VERSION_KEY];
  if (requestedProtocolVersion.isNull()) {
    return request.ReportError("\"" + kPROTOCOL_VERSION_KEY +
                               "\" is required for \"" + kHANDSHAKE_TYPE +
                               "\".");
  }

  if (!requestedProtocolVersion.isObject()) {
    return request.ReportError("\"" + kPROTOCOL_VERSION_KEY +
                               "\" must be a JSON object.");
  }

  Json::Value majorValue = requestedProtocolVersion[kMAJOR_KEY];
  if (!majorValue.isInt()) {
    return request.ReportError("\"" + kMAJOR_KEY +
                               "\" must be set and an integer.");
  }

  Json::Value minorValue = requestedProtocolVersion[kMINOR_KEY];
  if (!minorValue.isNull() && !minorValue.isInt()) {
    return request.ReportError("\"" + kMINOR_KEY +
                               "\" must be unset or an integer.");
  }

  const int major = majorValue.asInt();
  const int minor = minorValue.isNull() ? -1 : minorValue.asInt();
  if (major < 0) {
    return request.ReportError("\"" + kMAJOR_KEY + "\" must be >= 0.");
  }
  if (!minorValue.isNull() && minor < 0) {
    return request.ReportError("\"" + kMINOR_KEY +
                               "\" must be >= 0 when set.");
  }

  this->Protocol =
    cmServer::FindMatchingProtocol(this->SupportedProtocols, major, minor);
  if (!this->Protocol) {
    return request.ReportError("Protocol version not supported.");
  }

  std::string errorMessage;
  if (!this->Protocol->Activate(this, request, &errorMessage)) {
    this->Protocol = nullptr;
    return request.ReportError("Failed to activate protocol version: " +
                               errorMessage);
  }
  return request.Reply(Json::objectValue);
}